

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

memory_resource * std::pmr::local_malloc_free_resource(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if (local_malloc_free_resource()::instance != '\0') {
    return (memory_resource *)CONCAT71(in_register_00000001,local_malloc_free_resource()::instance);
  }
  local_malloc_free_resource();
  return (memory_resource *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

static
memory_resource* local_malloc_free_resource()
{
    struct malloc_free_resource : memory_resource {
        [[nodiscard]] void *
            do_allocate(size_t bytes, size_t alignment) override
        {
            // While this class is local, there is no need to check the
            // alignment, as we never ask for overaligned memory
            //if (alignment > alignof(max_align_t)) {
            //    throw bad_alloc();
            //}
            void *rv = malloc(bytes);
            if (nullptr == rv) {
                throw bad_alloc();
            }
            return rv;
        }

        void do_deallocate(void                    *p,
                           [[maybe_unused]] size_t  bytes,
                            [[maybe_unused]] size_t alignment) override
        {
            free(p);
        }

        bool do_is_equal(const memory_resource& that) const noexcept override
        {
            return nullptr != dynamic_cast<const malloc_free_resource*>(&that);
        }
    };

    static malloc_free_resource instance;
    return &instance;
}